

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddTestCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddTestCommand::Clone(cmAddTestCommand *this)

{
  cmCommand *this_00;
  cmAddTestCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmAddTestCommand((cmAddTestCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmAddTestCommand;
    }